

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall Api::initFromFile(Api *this,string string)

{
  EventHandler *e;
  uint uVar1;
  AEntity *pAVar2;
  Minion *pMVar3;
  Weapon *pWVar4;
  int iVar5;
  bool bVar6;
  
  e = &this->_event;
  iVar5 = 0x1e;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    uVar1 = rand();
    pAVar2 = (AEntity *)operator_new(0x30);
    if ((uVar1 & 1) == 0) {
      pMVar3 = (Minion *)operator_new(0xb0);
      Minion1::Minion1((Minion1 *)pMVar3,e);
      AEntity::AEntity(pAVar2,pMVar3);
    }
    else {
      pWVar4 = (Weapon *)operator_new(0xa0);
      Weapon1::Weapon1((Weapon1 *)pWVar4,e);
      AEntity::AEntity(pAVar2,pWVar4);
    }
    addCardToPlayer(this,0,pAVar2);
  }
  iVar5 = 0x1e;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    uVar1 = rand();
    pAVar2 = (AEntity *)operator_new(0x30);
    if ((uVar1 & 1) == 0) {
      pMVar3 = (Minion *)operator_new(0xb0);
      Minion1::Minion1((Minion1 *)pMVar3,e);
      AEntity::AEntity(pAVar2,pMVar3);
    }
    else {
      pWVar4 = (Weapon *)operator_new(0xa0);
      Weapon1::Weapon1((Weapon1 *)pWVar4,e);
      AEntity::AEntity(pAVar2,pWVar4);
    }
    addCardToPlayer(this,1,pAVar2);
  }
  return;
}

Assistant:

void Api::initFromFile(std::string string) {
    // TODO: generate players deck from file
    // tmp generation deck from exemple class weapon1 and minion1
    for (int i = 0; i < 30; ++i) {
        if (rand() % 2) {
            this->addCardToPlayer(0, new AEntity(new Weapon1(_event)));
        } else {
            this->addCardToPlayer(0, new AEntity(new Minion1(_event)));
        }
    }
    for (int i = 0; i < 30; ++i) {
        if (rand() % 2) {
            this->addCardToPlayer(1, new AEntity(new Weapon1(_event)));
        } else {
            this->addCardToPlayer(1, new AEntity(new Minion1(_event)));
        }
    }
}